

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O3

int WebRtcIsac_EncodeSpec
              (int16_t *fr,int16_t *fi,int16_t AvgPitchGain_Q12,ISACBand band,Bitstr *streamdata)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  int k;
  uint uVar60;
  long lVar61;
  int16_t (*paiVar62) [60];
  ulong uVar63;
  long lVar64;
  int iVar65;
  uint uVar66;
  uint32_t seed;
  int32_t *piVar67;
  int16_t *a;
  byte bVar68;
  int32_t *R;
  bool bVar69;
  int iVar70;
  int iVar79;
  int iVar80;
  undefined1 in_XMM2 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined4 uVar156;
  int iVar86;
  undefined1 in_XMM3 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  short sVar87;
  short sVar100;
  undefined4 uVar157;
  undefined4 uVar88;
  short sVar101;
  short sVar102;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar103;
  undefined4 uVar104;
  short sVar107;
  short sVar108;
  short sVar109;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar110;
  ulong uVar111;
  short sVar119;
  short sVar120;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  short sVar121;
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  short sVar146;
  short sVar147;
  short sVar148;
  undefined1 auVar124 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  int16_t ARCoefQ12 [7];
  int32_t gain2_Q10;
  int32_t CorrQ7 [7];
  int32_t CorrQ7_norm [7];
  int16_t RCQ15 [6];
  int16_t ditherQ7 [480];
  uint16_t invARSpecQ8 [120];
  int32_t PSpec [120];
  int32_t invARSpec2_Q16 [120];
  int16_t dataQ7 [480];
  ushort local_cd4;
  int local_cd0;
  int16_t local_cca [7];
  int32_t local_cbc;
  uint local_cb8 [8];
  int32_t local_c98;
  int local_c94 [8];
  int16_t local_c74 [6];
  undefined4 local_c68;
  undefined4 uStack_c64;
  ushort auStack_c60 [476];
  uint16_t local_8a8 [2];
  int aiStack_8a4 [59];
  uint auStack_7b8 [4];
  undefined1 auStack_7a8 [464];
  uint local_5d8 [120];
  int16_t local_3f8 [4];
  undefined8 auStack_3f0 [120];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined2 uVar78;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar81 [16];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar89 [16];
  undefined1 auVar115 [16];
  undefined1 auVar125 [16];
  undefined1 auVar135 [16];
  undefined1 auVar126 [16];
  undefined1 auVar136 [16];
  undefined1 auVar127 [16];
  undefined1 auVar137 [16];
  undefined1 auVar129 [16];
  undefined1 auVar128 [16];
  undefined1 auVar139 [16];
  undefined1 auVar138 [16];
  
  seed = streamdata->W_upper;
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb((int16_t *)&local_c68,seed,(int)AvgPitchGain_Q12,0);
    local_cd0 = 0x1e0;
    uVar110 = 0;
LAB_00155cec:
    local_cd4 = uVar110;
    lVar61 = 0;
    do {
      auVar71 = *(undefined1 (*) [16])((long)fr + lVar61);
      auVar113 = pshuflw(in_XMM3,auVar71,0xe8);
      auVar113 = pshufhw(auVar113,auVar113,0xe8);
      auVar71 = pshuflw(auVar71,auVar71,0xe7);
      auVar71 = pshufhw(auVar71,auVar71,0xe7);
      auVar155._0_4_ = auVar71._0_4_;
      auVar155._8_4_ = auVar71._8_4_;
      auVar155._12_4_ = auVar71._12_4_;
      auVar155._4_4_ = auVar155._8_4_;
      uVar110 = auStack_c60[lVar61];
      uVar63 = (ulong)*(uint *)((long)&local_c68 + lVar61 * 2) & 0xffffffff0000ffff;
      uVar2 = auStack_c60[lVar61 + 4];
      uVar3 = auStack_c60[lVar61 + 8];
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar63 | (ulong)uVar110 << 0x10 | (ulong)uVar2 << 0x20 | (ulong)uVar3 << 0x30
      ;
      auVar132 = pshuflw(auVar155,auVar155,0xb1);
      sVar87 = (short)uVar63;
      sVar87 = (auVar113._0_2_ + L'@' + sVar87 & 0xff80U) - sVar87;
      sVar100 = (auVar113._2_2_ + L'@' + uVar110 & 0xff80U) - uVar110;
      sVar101 = (auVar113._8_2_ + L'@' + uVar2 & 0xff80U) - uVar2;
      sVar102 = (auVar113._10_2_ + L'@' + uVar3 & 0xff80U) - uVar3;
      uVar66 = CONCAT22(sVar102,sVar101);
      auVar130._0_10_ = (unkuint10)uVar66 << 0x20;
      auVar43._4_8_ = 0;
      auVar43._0_4_ = uVar66;
      auVar113._0_12_ = auVar43 << 0x20;
      auVar71 = *(undefined1 (*) [16])((long)fi + lVar61);
      auVar155 = pshuflw(auVar140,auVar71,0xe8);
      auVar155 = pshufhw(auVar155,auVar155,0xe8);
      auVar71 = pshuflw(auVar71,auVar71,0xe7);
      auVar71 = pshufhw(auVar71,auVar71,0xe7);
      auVar142._0_4_ = auVar71._0_4_;
      auVar142._8_4_ = auVar71._8_4_;
      auVar142._12_4_ = auVar71._12_4_;
      auVar142._4_4_ = auVar142._8_4_;
      sVar103 = *(short *)((long)&local_c68 + lVar61 * 2 + 2);
      auVar71 = pshuflw(auVar142,auVar142,0xb1);
      sVar103 = (auVar155._0_2_ + L'@' + sVar103 & 0xff80U) - sVar103;
      sVar119 = (auVar155._2_2_ + L'@' + auStack_c60[lVar61 + 1] & 0xff80U) -
                auStack_c60[lVar61 + 1];
      uVar88 = CONCAT22(sVar119,sVar103);
      sVar120 = (auVar155._8_2_ + L'@' + auStack_c60[lVar61 + 5] & 0xff80U) -
                auStack_c60[lVar61 + 5];
      sVar121 = (auVar155._10_2_ + L'@' + auStack_c60[lVar61 + 9] & 0xff80U) -
                auStack_c60[lVar61 + 9];
      uVar63 = CONCAT26(sVar121,CONCAT24(sVar120,uVar88));
      auVar139._10_2_ = 0;
      auVar139._0_10_ = CONCAT28(0,uVar63);
      auVar139._12_2_ = sVar121;
      auVar139._14_2_ = sVar102;
      auVar138._12_4_ = auVar139._12_4_;
      auVar138._10_2_ = sVar101;
      auVar138._0_10_ = CONCAT28(0,uVar63);
      auVar137._10_6_ = auVar138._10_6_;
      auVar137._8_2_ = sVar120;
      auVar137._0_8_ = uVar63;
      auVar136._8_8_ = auVar137._8_8_;
      auVar136._6_2_ = sVar100;
      auVar136._0_6_ = CONCAT24(sVar120,uVar88);
      auVar135._6_10_ = auVar136._6_10_;
      auVar135._4_2_ = sVar119;
      auVar135._0_4_ = uVar88;
      auVar134._4_12_ = auVar135._4_12_;
      auVar134._2_2_ = sVar87;
      auVar134._0_2_ = sVar103;
      sVar146 = (short)*(undefined4 *)((long)&uStack_c64 + lVar61 * 2);
      auVar140 = pmaddwd(auVar134,auVar134);
      uVar110 = (auVar132._0_2_ + L'@' + sVar146 & 0xff80U) - sVar146;
      sVar107 = (auVar132._2_2_ + L'@' + auStack_c60[lVar61 + 2] & 0xff80U) -
                auStack_c60[lVar61 + 2];
      sVar108 = (auVar132._4_2_ + L'@' + auStack_c60[lVar61 + 6] & 0xff80U) -
                auStack_c60[lVar61 + 6];
      sVar109 = (auVar132._6_2_ + L'@' + auStack_c60[lVar61 + 10] & 0xff80U) -
                auStack_c60[lVar61 + 10];
      uVar60 = CONCAT22(sVar109,sVar108);
      auVar93._0_10_ = (unkuint10)uVar60 << 0x20;
      auVar44._4_8_ = 0;
      auVar44._0_4_ = uVar60;
      auVar94._0_12_ = auVar44 << 0x20;
      auVar45._4_8_ = 0;
      auVar45._0_4_ = uVar60;
      auVar8._12_2_ = sVar109;
      auVar8._0_12_ = auVar45 << 0x20;
      auVar26._6_8_ = 0;
      auVar26._0_6_ = (uint6)(CONCAT46(auVar8._10_4_,CONCAT24(sVar108,uVar60)) >> 0x20);
      auVar152._6_8_ = SUB148(auVar26 << 0x40,6);
      auVar152._4_2_ = sVar107;
      auVar152._2_2_ = 0;
      auVar152._0_2_ = uVar110;
      auVar152._14_2_ = 0;
      auVar155 = pmaddwd(auVar152,auVar152);
      sVar146 = *(short *)((long)&uStack_c64 + lVar61 * 2 + 2);
      auVar116._0_2_ = (auVar71._0_2_ + L'@' + sVar146 & 0xff80U) - sVar146;
      sVar146 = (auVar71._2_2_ + L'@' + auStack_c60[lVar61 + 3] & 0xff80U) - auStack_c60[lVar61 + 3]
      ;
      uVar104 = CONCAT22(sVar146,auVar116._0_2_);
      sVar147 = (auVar71._4_2_ + L'@' + auStack_c60[lVar61 + 7] & 0xff80U) - auStack_c60[lVar61 + 7]
      ;
      sVar148 = (auVar71._6_2_ + L'@' + auStack_c60[lVar61 + 0xb] & 0xff80U) -
                auStack_c60[lVar61 + 0xb];
      uVar111 = CONCAT26(sVar148,CONCAT24(sVar147,uVar104));
      auVar151._12_4_ = (undefined4)(uVar111 >> 0x20);
      auVar151._4_4_ = uVar60;
      auVar151._0_4_ = auVar151._12_4_;
      auVar151._8_4_ = uVar104;
      auVar152 = pshuflw(auVar151,auVar151,0x72);
      auVar141._12_4_ = (undefined4)(uVar63 >> 0x20);
      auVar141._4_4_ = uVar66;
      auVar141._0_4_ = auVar141._12_4_;
      auVar141._8_4_ = uVar88;
      auVar142 = pshuflw(auVar141,auVar141,0x72);
      auVar143._0_8_ = auVar142._0_8_;
      auVar143._8_4_ = auVar142._4_4_;
      auVar143._12_4_ = auVar152._4_4_;
      auVar94._12_2_ = sVar109;
      auVar94._14_2_ = sVar148;
      auVar93._12_4_ = auVar94._12_4_;
      auVar93._10_2_ = sVar147;
      auVar58._6_6_ = 0;
      auVar58._0_6_ = auVar93._10_6_;
      auVar46._2_2_ = sVar146;
      auVar46._0_2_ = sVar108;
      auVar46._4_8_ = SUB128(auVar58 << 0x30,4);
      auVar27._2_10_ = auVar46._2_10_;
      auVar27._0_2_ = sVar107;
      in_XMM3._6_2_ = auVar116._0_2_;
      in_XMM3._4_2_ = uVar110;
      auVar113._12_2_ = sVar102;
      auVar113._14_2_ = sVar121;
      auVar130._12_4_ = auVar113._12_4_;
      auVar130._10_2_ = sVar120;
      auVar55._4_2_ = sVar101;
      auVar55._0_4_ = uVar66;
      auVar55._6_6_ = auVar130._10_6_;
      auVar47._2_2_ = sVar119;
      auVar47._0_2_ = sVar101;
      auVar47._4_8_ = auVar55._4_8_;
      auVar28._2_10_ = auVar47._2_10_;
      auVar28._0_2_ = sVar100;
      auVar71._0_4_ = CONCAT22(sVar103,sVar87);
      auVar71._4_12_ = auVar28;
      auVar132._0_8_ = auVar71._0_8_;
      auVar132._8_4_ = auVar28._0_4_;
      auVar132._12_4_ = auVar27._0_4_;
      in_XMM3._8_8_ = auVar132._8_8_;
      in_XMM3._0_4_ = auVar71._0_4_;
      *(undefined1 (*) [16])(local_3f8 + lVar61) = in_XMM3;
      *(ulong *)((long)auStack_3f0 + lVar61 * 2 + 8) = CONCAT44(auVar152._0_4_,auVar142._0_4_);
      *(long *)((long)auStack_3f0 + lVar61 * 2 + 0x10) = auVar143._8_8_;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar111;
      auVar9._12_2_ = sVar148;
      auVar15._8_2_ = sVar147;
      auVar15._0_8_ = uVar111;
      auVar15._10_4_ = auVar9._10_4_;
      auVar29._6_8_ = 0;
      auVar29._0_6_ = auVar15._8_6_;
      auVar19._4_2_ = sVar146;
      auVar19._0_4_ = uVar104;
      auVar19._6_8_ = SUB148(auVar29 << 0x40,6);
      auVar116._2_2_ = 0;
      auVar116._4_10_ = auVar19._4_10_;
      auVar116._14_2_ = 0;
      auVar71 = pmaddwd(auVar116,auVar116);
      *(uint *)((long)auStack_7b8 + lVar61) =
           (uint)(auVar71._0_4_ + auVar155._0_4_ + auVar140._0_4_) >> 2;
      *(uint *)((long)auStack_7b8 + lVar61 + 4) =
           (uint)(auVar71._4_4_ + auVar155._4_4_ + auVar140._4_4_) >> 2;
      *(uint *)((long)auStack_7b8 + lVar61 + 8) =
           (uint)(auVar71._8_4_ + auVar155._8_4_ + auVar140._8_4_) >> 2;
      *(uint *)(auStack_7a8 + lVar61 + -4) =
           (uint)(auVar71._12_4_ + auVar155._12_4_ + auVar140._12_4_) >> 2;
      lVar61 = lVar61 + 0x10;
    } while (lVar61 != 0x1e0);
  }
  else {
    lVar61 = 0;
    do {
      iVar65 = seed * 0xbb38435;
      seed = iVar65 + 0x3619636b;
      *(short *)((long)&local_c68 + lVar61 * 2) = (short)(iVar65 + 0x3719636b >> 0x1b);
      lVar61 = lVar61 + 1;
    } while (lVar61 != 0x1e0);
    bVar69 = band == kIsacUpperBand12;
    local_cd4 = (ushort)bVar69;
    local_cd0 = 0x1e0;
    if (bVar69) {
      local_cd0 = 0xf0;
    }
    uVar110 = (ushort)bVar69;
    if (band == kIsacLowerBand) goto LAB_00155cec;
    if (band == kIsacUpperBand12) {
      lVar61 = 0;
      do {
        auVar71 = *(undefined1 (*) [16])((long)fr + lVar61);
        auVar113 = pshuflw(in_XMM3,auVar71,0xe8);
        auVar113 = pshufhw(auVar113,auVar113,0xe8);
        auVar71 = pshuflw(auVar71,auVar71,0xe7);
        auVar71 = pshufhw(auVar71,auVar71,0xe7);
        auVar95._0_4_ = auVar71._0_4_;
        auVar95._8_4_ = auVar71._8_4_;
        auVar95._12_4_ = auVar71._12_4_;
        auVar95._4_4_ = auVar95._8_4_;
        sVar103 = (short)*(undefined4 *)((long)&local_c68 + lVar61 * 2);
        auVar130 = pshuflw(auVar95,auVar95,0xb1);
        uVar110 = (auVar113._0_2_ + L'@' + sVar103 & 0xff80U) - sVar103;
        sVar146 = (auVar113._2_2_ + L'@' + auStack_c60[lVar61] & 0xff80U) - auStack_c60[lVar61];
        sVar87 = (auVar113._8_2_ + L'@' + auStack_c60[lVar61 + 4] & 0xff80U) -
                 auStack_c60[lVar61 + 4];
        sVar100 = (auVar113._10_2_ + L'@' + auStack_c60[lVar61 + 8] & 0xff80U) -
                  auStack_c60[lVar61 + 8];
        uVar66 = CONCAT22(sVar100,sVar87);
        auVar82._0_10_ = (unkuint10)uVar66 << 0x20;
        auVar48._4_8_ = 0;
        auVar48._0_4_ = uVar66;
        auVar83._0_12_ = auVar48 << 0x20;
        auVar49._4_8_ = 0;
        auVar49._0_4_ = uVar66;
        auVar10._12_2_ = sVar100;
        auVar10._0_12_ = auVar49 << 0x20;
        auVar30._6_8_ = 0;
        auVar30._0_6_ = (uint6)(CONCAT46(auVar10._10_4_,CONCAT24(sVar87,uVar66)) >> 0x20);
        auVar117._6_8_ = SUB148(auVar30 << 0x40,6);
        auVar117._4_2_ = sVar146;
        auVar117._2_2_ = 0;
        auVar117._0_2_ = uVar110;
        auVar117._14_2_ = 0;
        auVar113 = pmaddwd(auVar117,auVar117);
        auVar71 = *(undefined1 (*) [16])((long)fi + lVar61);
        auVar132 = pshuflw(in_XMM7,auVar71,0xe8);
        auVar132 = pshufhw(auVar132,auVar132,0xe8);
        auVar71 = pshuflw(auVar71,auVar71,0xe7);
        auVar71 = pshufhw(auVar71,auVar71,0xe7);
        auVar105._0_4_ = auVar71._0_4_;
        auVar105._8_4_ = auVar71._8_4_;
        auVar105._12_4_ = auVar71._12_4_;
        auVar105._4_4_ = auVar105._8_4_;
        auVar71 = pshuflw(auVar105,auVar105,0xb1);
        sVar103 = *(short *)((long)&local_c68 + lVar61 * 2 + 2);
        auVar123._0_2_ = (auVar132._0_2_ + L'@' + sVar103 & 0xff80U) - sVar103;
        sVar103 = (auVar132._2_2_ + L'@' + auStack_c60[lVar61 + 1] & 0xff80U) -
                  auStack_c60[lVar61 + 1];
        uVar88 = CONCAT22(sVar103,auVar123._0_2_);
        sVar101 = (auVar132._8_2_ + L'@' + auStack_c60[lVar61 + 5] & 0xff80U) -
                  auStack_c60[lVar61 + 5];
        sVar102 = (auVar132._10_2_ + L'@' + auStack_c60[lVar61 + 9] & 0xff80U) -
                  auStack_c60[lVar61 + 9];
        uVar111 = CONCAT26(sVar102,CONCAT24(sVar101,uVar88));
        auVar83._12_2_ = sVar100;
        auVar83._14_2_ = sVar102;
        auVar82._12_4_ = auVar83._12_4_;
        auVar82._10_2_ = sVar101;
        auVar56._4_2_ = sVar87;
        auVar56._0_4_ = uVar66;
        auVar56._6_6_ = auVar82._10_6_;
        auVar50._2_2_ = sVar103;
        auVar50._0_2_ = sVar87;
        auVar50._4_8_ = auVar56._4_8_;
        auVar31._2_10_ = auVar50._2_10_;
        auVar31._0_2_ = sVar146;
        uVar156 = CONCAT22(auVar123._0_2_,uVar110);
        auVar81._4_12_ = auVar31;
        auVar11._8_4_ = 0;
        auVar11._0_8_ = uVar111;
        auVar11._12_2_ = sVar102;
        auVar16._8_2_ = sVar101;
        auVar16._0_8_ = uVar111;
        auVar16._10_4_ = auVar11._10_4_;
        auVar32._6_8_ = 0;
        auVar32._0_6_ = auVar16._8_6_;
        auVar20._4_2_ = sVar103;
        auVar20._0_4_ = uVar88;
        auVar20._6_8_ = SUB148(auVar32 << 0x40,6);
        auVar123._2_2_ = 0;
        auVar123._4_10_ = auVar20._4_10_;
        auVar123._14_2_ = 0;
        auVar132 = pmaddwd(auVar123,auVar123);
        auVar155 = auVar132 & auVar113;
        auVar132 = auVar132 ^ auVar113;
        iVar65 = (auVar132._0_4_ >> 1) + auVar155._0_4_;
        iVar70 = (auVar132._4_4_ >> 1) + auVar155._4_4_;
        auVar85._4_4_ = iVar70;
        auVar85._0_4_ = iVar65;
        sVar103 = (short)*(undefined4 *)((long)&uStack_c64 + lVar61 * 2);
        uVar110 = (auVar130._0_2_ + L'@' + sVar103 & 0xff80U) - sVar103;
        sVar146 = (auVar130._2_2_ + L'@' + auStack_c60[lVar61 + 2] & 0xff80U) -
                  auStack_c60[lVar61 + 2];
        sVar87 = (auVar130._4_2_ + L'@' + auStack_c60[lVar61 + 6] & 0xff80U) -
                 auStack_c60[lVar61 + 6];
        sVar100 = (auVar130._6_2_ + L'@' + auStack_c60[lVar61 + 10] & 0xff80U) -
                  auStack_c60[lVar61 + 10];
        uVar60 = CONCAT22(sVar100,sVar87);
        auVar96._0_10_ = (unkuint10)uVar60 << 0x20;
        auVar51._4_8_ = 0;
        auVar51._0_4_ = uVar60;
        auVar97._0_12_ = auVar51 << 0x20;
        auVar52._4_8_ = 0;
        auVar52._0_4_ = uVar60;
        auVar12._12_2_ = sVar100;
        auVar12._0_12_ = auVar52 << 0x20;
        auVar33._6_8_ = 0;
        auVar33._0_6_ = (uint6)(CONCAT46(auVar12._10_4_,CONCAT24(sVar87,uVar60)) >> 0x20);
        auVar118._6_8_ = SUB148(auVar33 << 0x40,6);
        auVar118._4_2_ = sVar146;
        auVar118._2_2_ = 0;
        auVar118._0_2_ = uVar110;
        auVar118._14_2_ = 0;
        sVar103 = *(short *)((long)&uStack_c64 + lVar61 * 2 + 2);
        auVar130 = pmaddwd(auVar118,auVar118);
        auVar106._0_2_ = (auVar71._0_2_ + L'@' + sVar103 & 0xff80U) - sVar103;
        sVar103 = (auVar71._2_2_ + L'@' + auStack_c60[lVar61 + 3] & 0xff80U) -
                  auStack_c60[lVar61 + 3];
        uVar104 = CONCAT22(sVar103,auVar106._0_2_);
        sVar101 = (auVar71._4_2_ + L'@' + auStack_c60[lVar61 + 7] & 0xff80U) -
                  auStack_c60[lVar61 + 7];
        sVar102 = (auVar71._6_2_ + L'@' + auStack_c60[lVar61 + 0xb] & 0xff80U) -
                  auStack_c60[lVar61 + 0xb];
        uVar63 = CONCAT26(sVar102,CONCAT24(sVar101,uVar104));
        auVar153._12_4_ = (undefined4)(uVar63 >> 0x20);
        auVar153._4_4_ = uVar60;
        auVar153._0_4_ = auVar153._12_4_;
        auVar153._8_4_ = uVar104;
        auVar113 = pshuflw(auVar153,auVar153,0x72);
        auVar144._12_4_ = (undefined4)(uVar111 >> 0x20);
        auVar144._4_4_ = uVar66;
        auVar144._0_4_ = auVar144._12_4_;
        auVar144._8_4_ = uVar88;
        auVar71 = pshuflw(auVar144,auVar144,0x72);
        auVar145._0_8_ = auVar71._0_8_;
        auVar145._8_4_ = auVar71._4_4_;
        auVar145._12_4_ = auVar113._4_4_;
        auVar97._12_2_ = sVar100;
        auVar97._14_2_ = sVar102;
        auVar96._12_4_ = auVar97._12_4_;
        auVar96._10_2_ = sVar101;
        auVar59._6_6_ = 0;
        auVar59._0_6_ = auVar96._10_6_;
        auVar53._2_2_ = sVar103;
        auVar53._0_2_ = sVar87;
        auVar53._4_8_ = SUB128(auVar59 << 0x30,4);
        auVar34._2_10_ = auVar53._2_10_;
        auVar34._0_2_ = sVar146;
        uVar88 = CONCAT22(auVar106._0_2_,uVar110);
        auVar84._0_8_ = auVar81._0_8_;
        auVar84._8_4_ = auVar31._0_4_;
        auVar84._12_4_ = auVar34._0_4_;
        *(ulong *)(local_3f8 + lVar61) = CONCAT44(uVar88,uVar156);
        *(long *)((long)auStack_3f0 + lVar61 * 2) = auVar84._8_8_;
        *(ulong *)((long)auStack_3f0 + lVar61 * 2 + 8) = CONCAT44(auVar113._0_4_,auVar71._0_4_);
        *(long *)((long)auStack_3f0 + lVar61 * 2 + 0x10) = auVar145._8_8_;
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar63;
        auVar13._12_2_ = sVar102;
        auVar17._8_2_ = sVar101;
        auVar17._0_8_ = uVar63;
        auVar17._10_4_ = auVar13._10_4_;
        auVar35._6_8_ = 0;
        auVar35._0_6_ = auVar17._8_6_;
        auVar21._4_2_ = sVar103;
        auVar21._0_4_ = uVar104;
        auVar21._6_8_ = SUB148(auVar35 << 0x40,6);
        auVar106._2_2_ = 0;
        auVar106._4_10_ = auVar21._4_10_;
        auVar106._14_2_ = 0;
        auVar113 = pmaddwd(auVar106,auVar106);
        auVar71 = auVar113 & auVar130;
        auVar113 = auVar113 ^ auVar130;
        auVar85._8_4_ = iVar70;
        auVar85._12_4_ = (auVar113._4_4_ >> 1) + auVar71._4_4_;
        in_XMM3._8_8_ = auVar85._8_8_;
        in_XMM3._4_4_ = (auVar113._0_4_ >> 1) + auVar71._0_4_;
        in_XMM3._0_4_ = iVar65;
        in_XMM7._4_4_ = (auVar113._8_4_ >> 1) + auVar71._8_4_;
        in_XMM7._0_4_ = (auVar132._8_4_ >> 1) + auVar155._8_4_;
        in_XMM7._8_4_ = (auVar132._12_4_ >> 1) + auVar155._12_4_;
        in_XMM7._12_4_ = (auVar113._12_4_ >> 1) + auVar71._12_4_;
        *(undefined1 (*) [16])(auStack_7a8 + lVar61 * 2) = in_XMM7;
        *(undefined1 (*) [16])((long)auStack_7b8 + lVar61 * 2) = in_XMM3;
        lVar61 = lVar61 + 0x10;
      } while (lVar61 != 0xf0);
    }
    else if (band == kIsacUpperBand16) {
      lVar61 = 0x3b;
      lVar64 = 0;
      auVar71 = pshuflw(in_XMM2,_u______001a0870,0x1b);
      do {
        uVar4 = *(undefined8 *)((long)fr + lVar64);
        sVar87 = ((short)uVar4 + u______001a0870[0] + (short)(&local_c68)[lVar64] & 0xff80U) -
                 (short)(&local_c68)[lVar64];
        sVar100 = ((short)((ulong)uVar4 >> 0x10) + u______001a0870[1] + auStack_c60[lVar64 * 2] &
                  0xff80) - auStack_c60[lVar64 * 2];
        sVar101 = ((short)((ulong)uVar4 >> 0x20) + u______001a0870[2] + auStack_c60[lVar64 * 2 + 4]
                  & 0xff80) - auStack_c60[lVar64 * 2 + 4];
        sVar102 = ((short)((ulong)uVar4 >> 0x30) + u______001a0870[3] + auStack_c60[lVar64 * 2 + 8]
                  & 0xff80) - auStack_c60[lVar64 * 2 + 8];
        uVar66 = CONCAT22(sVar102,sVar101);
        auVar90._0_10_ = (unkuint10)uVar66 << 0x20;
        auVar38._4_8_ = 0;
        auVar38._0_4_ = uVar66;
        auVar91._0_12_ = auVar38 << 0x20;
        uVar4 = *(undefined8 *)((long)fi + lVar64);
        sVar103 = *(short *)((long)&local_c68 + lVar64 * 4 + 2);
        sVar103 = ((short)uVar4 + u______001a0870[0] + sVar103 & 0xff80U) - sVar103;
        sVar107 = ((short)((ulong)uVar4 >> 0x10) + u______001a0870[1] + auStack_c60[lVar64 * 2 + 1]
                  & 0xff80) - auStack_c60[lVar64 * 2 + 1];
        uVar88 = CONCAT22(sVar107,sVar103);
        sVar108 = ((short)((ulong)uVar4 >> 0x20) + u______001a0870[2] + auStack_c60[lVar64 * 2 + 5]
                  & 0xff80) - auStack_c60[lVar64 * 2 + 5];
        sVar109 = ((short)((ulong)uVar4 >> 0x30) + u______001a0870[3] + auStack_c60[lVar64 * 2 + 9]
                  & 0xff80) - auStack_c60[lVar64 * 2 + 9];
        uVar63 = CONCAT26(sVar109,CONCAT24(sVar108,uVar88));
        auVar129._10_2_ = 0;
        auVar129._0_10_ = CONCAT28(0,uVar63);
        auVar129._12_2_ = sVar109;
        auVar129._14_2_ = sVar102;
        auVar128._12_4_ = auVar129._12_4_;
        auVar128._10_2_ = sVar101;
        auVar128._0_10_ = CONCAT28(0,uVar63);
        auVar127._10_6_ = auVar128._10_6_;
        auVar127._8_2_ = sVar108;
        auVar127._0_8_ = uVar63;
        auVar126._8_8_ = auVar127._8_8_;
        auVar126._6_2_ = sVar100;
        auVar126._0_6_ = CONCAT24(sVar108,uVar88);
        auVar125._6_10_ = auVar126._6_10_;
        auVar125._4_2_ = sVar107;
        auVar125._0_4_ = uVar88;
        auVar124._4_12_ = auVar125._4_12_;
        auVar124._2_2_ = sVar87;
        auVar124._0_2_ = sVar103;
        auVar130 = pmaddwd(auVar124,auVar124);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)(fr + lVar61 * 4);
        auVar113 = pshuflw(auVar112,auVar112,0x1b);
        uVar110 = (auVar113._0_2_ + auVar71._0_2_ + (short)(&uStack_c64)[lVar64] & 0xff80U) -
                  (short)(&uStack_c64)[lVar64];
        sVar119 = (auVar113._2_2_ + auVar71._2_2_ + auStack_c60[lVar64 * 2 + 2] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 2];
        sVar120 = (auVar113._4_2_ + auVar71._4_2_ + auStack_c60[lVar64 * 2 + 6] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 6];
        sVar121 = (auVar113._6_2_ + auVar71._6_2_ + auStack_c60[lVar64 * 2 + 10] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 10];
        uVar60 = CONCAT22(sVar121,sVar120);
        auVar114._0_10_ = (unkuint10)uVar60 << 0x20;
        auVar39._4_8_ = 0;
        auVar39._0_4_ = uVar60;
        auVar115._0_12_ = auVar39 << 0x20;
        auVar40._4_8_ = 0;
        auVar40._0_4_ = uVar60;
        auVar6._12_2_ = sVar121;
        auVar6._0_12_ = auVar40 << 0x20;
        auVar22._6_8_ = 0;
        auVar22._0_6_ = (uint6)(CONCAT46(auVar6._10_4_,CONCAT24(sVar120,uVar60)) >> 0x20);
        auVar122._6_8_ = SUB148(auVar22 << 0x40,6);
        auVar122._4_2_ = sVar119;
        auVar122._2_2_ = 0;
        auVar122._0_2_ = uVar110;
        auVar122._14_2_ = 0;
        auVar113 = pmaddwd(auVar122,auVar122);
        sVar146 = *(short *)((long)&uStack_c64 + lVar64 * 4 + 2);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(fi + lVar61 * 4);
        auVar132 = pshuflw(auVar131,auVar131,0x1b);
        auVar133._0_2_ = (auVar132._0_2_ + auVar71._0_2_ + sVar146 & 0xff80U) - sVar146;
        sVar146 = (auVar132._2_2_ + auVar71._2_2_ + auStack_c60[lVar64 * 2 + 3] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 3];
        uVar104 = CONCAT22(sVar146,auVar133._0_2_);
        sVar147 = (auVar132._4_2_ + auVar71._4_2_ + auStack_c60[lVar64 * 2 + 7] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 7];
        sVar148 = (auVar132._6_2_ + auVar71._6_2_ + auStack_c60[lVar64 * 2 + 0xb] & 0xff80) -
                  auStack_c60[lVar64 * 2 + 0xb];
        uVar111 = CONCAT26(sVar148,CONCAT24(sVar147,uVar104));
        auVar154._12_4_ = (undefined4)(uVar111 >> 0x20);
        auVar154._4_4_ = uVar60;
        auVar154._0_4_ = auVar154._12_4_;
        auVar154._8_4_ = uVar104;
        auVar155 = pshuflw(auVar154,auVar154,0x72);
        auVar149._12_4_ = (undefined4)(uVar63 >> 0x20);
        auVar149._4_4_ = uVar66;
        auVar149._0_4_ = auVar149._12_4_;
        auVar149._8_4_ = uVar88;
        auVar132 = pshuflw(auVar149,auVar149,0x72);
        auVar150._0_8_ = auVar132._0_8_;
        auVar150._8_4_ = auVar132._4_4_;
        auVar150._12_4_ = auVar155._4_4_;
        auVar115._12_2_ = sVar121;
        auVar115._14_2_ = sVar148;
        auVar114._12_4_ = auVar115._12_4_;
        auVar114._10_2_ = sVar147;
        auVar57._6_6_ = 0;
        auVar57._0_6_ = auVar114._10_6_;
        auVar41._2_2_ = sVar146;
        auVar41._0_2_ = sVar120;
        auVar41._4_8_ = SUB128(auVar57 << 0x30,4);
        auVar23._2_10_ = auVar41._2_10_;
        auVar23._0_2_ = sVar119;
        uVar88 = CONCAT22(auVar133._0_2_,uVar110);
        auVar91._12_2_ = sVar102;
        auVar91._14_2_ = sVar109;
        auVar90._12_4_ = auVar91._12_4_;
        auVar90._10_2_ = sVar108;
        auVar54._4_2_ = sVar101;
        auVar54._0_4_ = uVar66;
        auVar54._6_6_ = auVar90._10_6_;
        auVar42._2_2_ = sVar107;
        auVar42._0_2_ = sVar101;
        auVar42._4_8_ = auVar54._4_8_;
        auVar24._2_10_ = auVar42._2_10_;
        auVar24._0_2_ = sVar100;
        uVar157 = CONCAT22(sVar103,sVar87);
        auVar89._4_12_ = auVar24;
        auVar92._0_8_ = auVar89._0_8_;
        auVar92._8_4_ = auVar24._0_4_;
        auVar92._12_4_ = auVar23._0_4_;
        *(ulong *)(local_3f8 + lVar64 * 2) = CONCAT44(uVar88,uVar157);
        *(long *)((long)auStack_3f0 + lVar64 * 4) = auVar92._8_8_;
        *(ulong *)((long)auStack_3f0 + lVar64 * 4 + 8) = CONCAT44(auVar155._0_4_,auVar132._0_4_);
        *(long *)((long)auStack_3f0 + lVar64 * 4 + 0x10) = auVar150._8_8_;
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar111;
        auVar7._12_2_ = sVar148;
        auVar14._8_2_ = sVar147;
        auVar14._0_8_ = uVar111;
        auVar14._10_4_ = auVar7._10_4_;
        auVar25._6_8_ = 0;
        auVar25._0_6_ = auVar14._8_6_;
        auVar18._4_2_ = sVar146;
        auVar18._0_4_ = uVar104;
        auVar18._6_8_ = SUB148(auVar25 << 0x40,6);
        auVar133._2_2_ = 0;
        auVar133._4_10_ = auVar18._4_10_;
        auVar133._14_2_ = 0;
        auVar132 = pmaddwd(auVar133,auVar133);
        lVar1 = lVar64 * 2;
        *(uint *)((long)auStack_7b8 + lVar1) =
             (uint)(auVar132._0_4_ + auVar113._0_4_ + auVar130._0_4_) >> 2;
        *(uint *)((long)auStack_7b8 + lVar1 + 4) =
             (uint)(auVar132._4_4_ + auVar113._4_4_ + auVar130._4_4_) >> 2;
        *(uint *)((long)auStack_7b8 + lVar1 + 8) =
             (uint)(auVar132._8_4_ + auVar113._8_4_ + auVar130._8_4_) >> 2;
        *(uint *)(auStack_7a8 + lVar1 + -4) =
             (uint)(auVar132._12_4_ + auVar113._12_4_ + auVar130._12_4_) >> 2;
        lVar64 = lVar64 + 8;
        lVar61 = lVar61 + -1;
      } while (lVar64 != 0xf0);
    }
  }
  lVar61 = 0x74;
  lVar64 = 0;
  do {
    uVar66 = auStack_7b8[lVar61];
    uVar60 = auStack_7b8[lVar61 + 1];
    uVar5 = auStack_7b8[lVar61 + 2];
    iVar65 = *(int *)(auStack_7a8 + lVar64 + -4);
    iVar70 = *(int *)((long)auStack_7b8 + lVar64) + 0x10;
    iVar79 = *(int *)((long)auStack_7b8 + lVar64 + 4) + 0x10;
    iVar80 = *(int *)((long)auStack_7b8 + lVar64 + 8) + 0x10;
    *(int *)((long)local_5d8 + lVar64) = (int)(iVar70 + uVar60) >> 5;
    *(int *)((long)local_5d8 + lVar64 + 4) = (int)(iVar79 + uVar5) >> 5;
    *(int *)((long)local_5d8 + lVar64 + 8) = (int)(iVar80 + uVar60) >> 5;
    *(int *)((long)local_5d8 + lVar64 + 0xc) = (int)(iVar65 + 0x10 + uVar66) >> 5;
    *(int *)((long)local_8a8 + lVar64) = (int)(iVar70 - uVar60) >> 5;
    *(int *)((long)aiStack_8a4 + lVar64) = (int)(iVar79 - uVar5) >> 5;
    *(int *)((long)aiStack_8a4 + lVar64 + 4) = (int)(iVar80 - uVar60) >> 5;
    *(int *)((long)aiStack_8a4 + lVar64 + 8) = (int)((iVar65 + 0x10) - uVar66) >> 5;
    lVar64 = lVar64 + 0x10;
    lVar61 = lVar61 + -4;
  } while (lVar61 != 0x38);
  iVar65 = 2;
  iVar70 = 0;
  iVar79 = 0;
  iVar80 = 0;
  lVar61 = 0;
  do {
    iVar65 = iVar65 + local_5d8[lVar61];
    iVar70 = iVar70 + local_5d8[lVar61 + 1];
    iVar79 = iVar79 + local_5d8[lVar61 + 2];
    iVar80 = iVar80 + local_5d8[lVar61 + 3];
    lVar61 = lVar61 + 4;
  } while (lVar61 != 0x3c);
  local_cb8[0] = iVar80 + iVar70 + iVar79 + iVar65;
  paiVar62 = WebRtcIsac_kCos;
  uVar63 = 0;
  do {
    iVar65 = 0;
    iVar70 = 0;
    iVar79 = 0;
    iVar80 = 0;
    lVar61 = 0;
    do {
      uVar111 = *(ulong *)(*paiVar62 + lVar61);
      uVar78 = (undefined2)(uVar111 >> 0x30);
      auVar74._8_4_ = 0;
      auVar74._0_8_ = uVar111;
      auVar74._12_2_ = uVar78;
      auVar74._14_2_ = uVar78;
      uVar78 = (undefined2)(uVar111 >> 0x20);
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._8_2_ = 0;
      auVar73._0_8_ = uVar111;
      auVar73._10_2_ = uVar78;
      auVar72._10_6_ = auVar73._10_6_;
      auVar72._8_2_ = uVar78;
      auVar72._0_8_ = uVar111;
      uVar78 = (undefined2)(uVar111 >> 0x10);
      auVar36._4_8_ = auVar72._8_8_;
      auVar36._2_2_ = uVar78;
      auVar36._0_2_ = uVar78;
      auVar71 = *(undefined1 (*) [16])(local_8a8 + lVar61 * 2);
      iVar86 = auVar71._4_4_;
      auVar98._4_4_ = iVar86;
      auVar98._0_4_ = iVar86;
      auVar98._8_4_ = auVar71._12_4_;
      auVar98._12_4_ = auVar71._12_4_;
      iVar65 = iVar65 + (auVar71._0_4_ * (int)(short)uVar111 + 0x100 >> 9);
      iVar70 = iVar70 + (iVar86 * (auVar36._0_4_ >> 0x10) + 0x100 >> 9);
      iVar79 = iVar79 + ((int)((auVar71._8_8_ & 0xffffffff) * (ulong)(uint)(auVar72._8_4_ >> 0x10))
                         + 0x100 >> 9);
      iVar80 = iVar80 + ((int)((auVar98._8_8_ & 0xffffffff) * (ulong)(uint)(auVar73._12_4_ >> 0x10))
                         + 0x100 >> 9);
      lVar61 = lVar61 + 4;
    } while (lVar61 != 0x3c);
    local_cb8[uVar63 + 1] = iVar80 + iVar70 + iVar79 + iVar65;
    paiVar62 = paiVar62 + 2;
    bVar69 = uVar63 < 4;
    uVar63 = uVar63 + 2;
  } while (bVar69);
  lVar61 = 0x1a7cb8;
  uVar63 = 1;
  do {
    iVar65 = 0;
    iVar70 = 0;
    iVar79 = 0;
    iVar80 = 0;
    lVar64 = 0;
    do {
      uVar111 = *(ulong *)(lVar61 + lVar64 * 2);
      uVar78 = (undefined2)(uVar111 >> 0x30);
      auVar77._8_4_ = 0;
      auVar77._0_8_ = uVar111;
      auVar77._12_2_ = uVar78;
      auVar77._14_2_ = uVar78;
      uVar78 = (undefined2)(uVar111 >> 0x20);
      auVar76._12_4_ = auVar77._12_4_;
      auVar76._8_2_ = 0;
      auVar76._0_8_ = uVar111;
      auVar76._10_2_ = uVar78;
      auVar75._10_6_ = auVar76._10_6_;
      auVar75._8_2_ = uVar78;
      auVar75._0_8_ = uVar111;
      uVar78 = (undefined2)(uVar111 >> 0x10);
      auVar37._4_8_ = auVar75._8_8_;
      auVar37._2_2_ = uVar78;
      auVar37._0_2_ = uVar78;
      auVar71 = *(undefined1 (*) [16])(local_5d8 + lVar64);
      iVar86 = auVar71._4_4_;
      auVar99._4_4_ = iVar86;
      auVar99._0_4_ = iVar86;
      auVar99._8_4_ = auVar71._12_4_;
      auVar99._12_4_ = auVar71._12_4_;
      iVar65 = iVar65 + (auVar71._0_4_ * (int)(short)uVar111 + 0x100 >> 9);
      iVar70 = iVar70 + (iVar86 * (auVar37._0_4_ >> 0x10) + 0x100 >> 9);
      iVar79 = iVar79 + ((int)((auVar71._8_8_ & 0xffffffff) * (ulong)(uint)(auVar75._8_4_ >> 0x10))
                         + 0x100 >> 9);
      iVar80 = iVar80 + ((int)((auVar99._8_8_ & 0xffffffff) * (ulong)(uint)(auVar76._12_4_ >> 0x10))
                         + 0x100 >> 9);
      lVar64 = lVar64 + 4;
    } while (lVar64 != 0x3c);
    local_cb8[uVar63 + 1] = iVar80 + iVar70 + iVar79 + iVar65;
    lVar61 = lVar61 + 0xf0;
    bVar69 = uVar63 < 4;
    uVar63 = uVar63 + 2;
  } while (bVar69);
  if (local_cb8[0] == 0) {
    uVar110 = 0;
    bVar68 = 0xee;
  }
  else {
    uVar66 = (int)local_cb8[0] >> 0x1f ^ local_cb8[0];
    sVar146 = (ushort)(uVar66 < 0x8000) * 0x10;
    sVar103 = sVar146 + 8;
    if (0x7fffff < uVar66 << (sbyte)sVar146) {
      sVar103 = sVar146;
    }
    sVar146 = sVar103 + 4;
    if (0x7ffffff < uVar66 << ((byte)sVar103 & 0x1f)) {
      sVar146 = sVar103;
    }
    sVar103 = sVar146 + 2;
    if (0x1fffffff < uVar66 << ((byte)sVar146 & 0x1f)) {
      sVar103 = sVar146;
    }
    uVar110 = sVar103 + (ushort)(uVar66 << ((byte)sVar103 & 0x1f) < 0x40000000);
    bVar68 = (char)uVar110 - 0x12;
    bVar69 = 0x12 < uVar110;
    if (bVar69) {
      lVar61 = 0;
      do {
        (&local_c98)[lVar61] = local_cb8[lVar61] << (bVar68 & 0x1f);
        lVar61 = lVar61 + 1;
      } while (lVar61 != 7);
      goto LAB_0015633d;
    }
  }
  lVar61 = 0;
  do {
    (&local_c98)[lVar61] = (int)local_cb8[lVar61] >> (0x12U - (char)uVar110 & 0x1f);
    lVar61 = lVar61 + 1;
  } while (lVar61 != 7);
  bVar69 = false;
LAB_0015633d:
  R = &local_c98;
  WebRtcSpl_AutoCorrToReflCoef(R,6,local_c74);
  WebRtcIsac_EncodeRc(local_c74,streamdata);
  a = local_cca;
  WebRtcSpl_ReflCoefToLpc(local_c74,6,a);
  uVar63 = 0;
  lVar61 = 1;
  uVar66 = 0;
  do {
    lVar64 = 0;
    piVar67 = R;
    do {
      uVar66 = uVar66 + (((int)local_cca[lVar64] * *piVar67 + 0x100 >> 9) * (int)local_cca[uVar63] +
                         4 >> 3);
      lVar64 = lVar64 + 1;
      piVar67 = piVar67 + -1;
    } while (lVar61 != lVar64);
    if (uVar63 < 6) {
      lVar64 = 1;
      do {
        uVar66 = uVar66 + (((int)a[lVar64] * (&local_c98)[lVar64] + 0x100 >> 9) *
                           (int)local_cca[uVar63] + 4 >> 3);
        lVar1 = uVar63 + lVar64;
        lVar64 = lVar64 + 1;
      } while (lVar1 != 6);
    }
    uVar63 = uVar63 + 1;
    lVar61 = lVar61 + 1;
    R = R + 1;
    a = a + 1;
  } while (uVar63 != 7);
  uVar60 = uVar66 << (0x12U - (char)uVar110 & 0x1f);
  if (bVar69) {
    uVar60 = uVar66 >> (bVar68 & 0x1f);
  }
  if (0x7ffffffe < uVar60) {
    uVar60 = 0x7fffffff;
  }
  local_cbc = WebRtcSpl_DivResultInQ31(0x78,uVar60);
  WebRtcIsac_EncodeGain2(&local_cbc,streamdata);
  FindInvArSpec(local_cca,local_cbc,(int32_t *)local_5d8);
  iVar70 = (uint)(0xffff < local_5d8[0]) * 0x10;
  iVar65 = iVar70 + 8;
  if ((local_5d8[0] >> (sbyte)iVar70 & 0xff00) == 0) {
    iVar65 = iVar70;
  }
  iVar70 = iVar65 + 4;
  if ((local_5d8[0] >> ((byte)iVar65 & 0x1f) & 0xf0) == 0) {
    iVar70 = iVar65;
  }
  iVar65 = iVar70 + 2;
  if ((local_5d8[0] >> ((byte)iVar70 & 0x1f) & 0xc) == 0) {
    iVar65 = iVar70;
  }
  uVar66 = (local_5d8[0] >> ((byte)iVar65 & 0x1f) & 2) >> 1;
  uVar66 = 1 << ((byte)((ushort)((short)uVar66 + (short)iVar65 +
                                (ushort)((local_5d8[0] >> (uVar66 + iVar65 & 0x1f) & 1) != 0)) >> 1)
                & 0x1f);
  lVar61 = 0;
  do {
    uVar60 = local_5d8[lVar61];
    uVar5 = -uVar60;
    if (0 < (int)uVar60) {
      uVar5 = uVar60;
    }
    uVar60 = uVar5 / uVar66 + uVar66 >> 1;
    iVar65 = -10;
    do {
      uVar66 = uVar60;
      uVar60 = uVar5 / uVar66 + uVar66 >> 1;
      if (uVar60 == uVar66) break;
      bVar69 = iVar65 != 0;
      iVar65 = iVar65 + 1;
    } while (bVar69);
    local_8a8[lVar61] = (uint16_t)uVar60;
    lVar61 = lVar61 + 1;
    if (lVar61 == 0x78) {
      iVar65 = WebRtcIsac_EncLogisticMulti2(streamdata,local_3f8,local_8a8,local_cd0,local_cd4);
      return (int)(short)iVar65 >> 0x1f & (int)(short)iVar65;
    }
  } while( true );
}

Assistant:

int WebRtcIsac_EncodeSpec(const int16_t* fr, const int16_t* fi,
                          int16_t AvgPitchGain_Q12, enum ISACBand band,
                          Bitstr* streamdata) {
  int16_t ditherQ7[FRAMESAMPLES];
  int16_t dataQ7[FRAMESAMPLES];
  int32_t PSpec[FRAMESAMPLES_QUARTER];
  int32_t invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int32_t CorrQ7[AR_ORDER + 1];
  int32_t CorrQ7_norm[AR_ORDER + 1];
  int16_t RCQ15[AR_ORDER];
  int16_t ARCoefQ12[AR_ORDER + 1];
  int32_t gain2_Q10;
  int16_t val;
  int32_t nrg, res;
  uint32_t sum;
  int32_t in_sqrt;
  int32_t newRes;
  int16_t err;
  uint32_t nrg_u32;
  int shift_var;
  int k, n, j, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;

  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(ditherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(ditherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* add dither and quantize, and compute power spectrum */
  switch (band) {
    case kIsacLowerBand: {
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, j = 0; k < FRAMESAMPLES_HALF; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;
      }
      break;
    }
    case kIsacUpperBand16: {
      for (j = 0, k = 0; k < FRAMESAMPLES; k += 4, j++) {
        val = ((fr[j] + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((fi[j] + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((fr[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 2] + 64) &
            0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((fi[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 3] + 64) &
            0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
  }

  /* compute correlation from power spectrum */
  FindCorrelation(PSpec, CorrQ7);

  /* Find AR coefficients */
  /* Aumber of bit shifts to 14-bit normalize CorrQ7[0]
   * (leaving room for sign) */
  shift_var = WebRtcSpl_NormW32(CorrQ7[0]) - 18;

  if (shift_var > 0) {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] << shift_var;
    }
  } else {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] >> (-shift_var);
    }
  }

  /* Find RC coefficients. */
  WebRtcSpl_AutoCorrToReflCoef(CorrQ7_norm, AR_ORDER, RCQ15);

  /* Quantize & code RC Coefficient. */
  WebRtcIsac_EncodeRc(RCQ15, streamdata);

  /* RC -> AR coefficients */
  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  /* Compute ARCoef' * Corr * ARCoef in Q19. */
  nrg = 0;
  for (j = 0; j <= AR_ORDER; j++) {
    for (n = 0; n <= j; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[j - n] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
    for (n = j + 1; n <= AR_ORDER; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[n - j] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
  }

  nrg_u32 = (uint32_t)nrg;
  if (shift_var > 0) {
    nrg_u32 = nrg_u32 >> shift_var;
  } else {
    nrg_u32 = nrg_u32 << (-shift_var);
  }
  if (nrg_u32 > 0x7FFFFFFF) {
    nrg = 0x7FFFFFFF;
  }  else {
    nrg = (int32_t)nrg_u32;
  }
  /* Also shifts 31 bits to the left! */
  gain2_Q10 = WebRtcSpl_DivResultInQ31(FRAMESAMPLES_QUARTER, nrg);

  /* Quantize & code gain2_Q10. */
  if (WebRtcIsac_EncodeGain2(&gain2_Q10, streamdata)) {
    return -1;
  }

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);
  /* Convert to magnitude spectrum, by doing square-roots
   * (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;
    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0) {
      in_sqrt = -in_sqrt;
    }
    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }
  /* arithmetic coding of spectrum */
  err = WebRtcIsac_EncLogisticMulti2(streamdata, dataQ7, invARSpecQ8,
                                     num_dft_coeff, is_12khz);
  if (err < 0) {
    return (err);
  }
  return 0;
}